

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

Value * __thiscall Json::Value::removeMember(Value *__return_storage_ptr__,Value *this,char *key)

{
  pointer ppVar1;
  bool bVar2;
  _Self local_50 [3];
  _Self local_38;
  iterator it;
  CZString actualKey;
  char *key_local;
  Value *this_local;
  Value *old;
  
  bVar2 = true;
  if ((*(ushort *)&this->field_0x8 & 0xff) != 0) {
    bVar2 = (*(ushort *)&this->field_0x8 & 0xff) == 7;
  }
  if (bVar2) {
    if ((*(ushort *)&this->field_0x8 & 0xff) == 0) {
      Value(__return_storage_ptr__,(Value *)null);
    }
    else {
      CZString::CZString((CZString *)&it,key,noDuplication);
      local_38._M_node =
           (_Base_ptr)
           std::
           map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
           ::find((this->value_).map_,(CZString *)&it);
      local_50[0]._M_node =
           (_Base_ptr)
           std::
           map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
           ::end((this->value_).map_);
      bVar2 = std::operator==(&local_38,local_50);
      if (bVar2) {
        Value(__return_storage_ptr__,(Value *)null);
      }
      else {
        ppVar1 = std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
                 operator->(&local_38);
        Value(__return_storage_ptr__,&ppVar1->second);
        std::
        map<Json::Value::CZString,Json::Value,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
        ::erase_abi_cxx11_((map<Json::Value::CZString,Json::Value,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
                            *)(this->value_).map_,(iterator)local_38._M_node);
      }
      CZString::~CZString((CZString *)&it);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("type_ == nullValue || type_ == objectValue",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/jsoncpp/src/lib_json/json_value.cpp"
                ,0x4eb,"Value Json::Value::removeMember(const char *)");
}

Assistant:

Value
Value::removeMember( const char* key )
{
   JSON_ASSERT( type_ == nullValue  ||  type_ == objectValue );
   if ( type_ == nullValue )
      return null;
#ifndef JSON_VALUE_USE_INTERNAL_MAP
   CZString actualKey( key, CZString::noDuplication );
   ObjectValues::iterator it = value_.map_->find( actualKey );
   if ( it == value_.map_->end() )
      return null;
   Value old(it->second);
   value_.map_->erase(it);
   return old;
#else
   Value *value = value_.map_->find( key );
   if (value){
      Value old(*value);
      value_.map_.remove( key );
      return old;
   } else {
      return null;
   }
#endif
}